

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int yaml_parser_state_machine(yaml_parser_t *parser,yaml_event_t *event)

{
  yaml_event_t *event_local;
  yaml_parser_t *parser_local;
  
  switch(parser->state) {
  case YAML_PARSE_STREAM_START_STATE:
    parser_local._4_4_ = yaml_parser_parse_stream_start(parser,event);
    break;
  case YAML_PARSE_IMPLICIT_DOCUMENT_START_STATE:
    parser_local._4_4_ = yaml_parser_parse_document_start(parser,event,1);
    break;
  case YAML_PARSE_DOCUMENT_START_STATE:
    parser_local._4_4_ = yaml_parser_parse_document_start(parser,event,0);
    break;
  case YAML_PARSE_DOCUMENT_CONTENT_STATE:
    parser_local._4_4_ = yaml_parser_parse_document_content(parser,event);
    break;
  case YAML_PARSE_DOCUMENT_END_STATE:
    parser_local._4_4_ = yaml_parser_parse_document_end(parser,event);
    break;
  case YAML_PARSE_BLOCK_NODE_STATE:
    parser_local._4_4_ = yaml_parser_parse_node(parser,event,1,0);
    break;
  case YAML_PARSE_BLOCK_NODE_OR_INDENTLESS_SEQUENCE_STATE:
    parser_local._4_4_ = yaml_parser_parse_node(parser,event,1,1);
    break;
  case YAML_PARSE_FLOW_NODE_STATE:
    parser_local._4_4_ = yaml_parser_parse_node(parser,event,0,0);
    break;
  case YAML_PARSE_BLOCK_SEQUENCE_FIRST_ENTRY_STATE:
    parser_local._4_4_ = yaml_parser_parse_block_sequence_entry(parser,event,1);
    break;
  case YAML_PARSE_BLOCK_SEQUENCE_ENTRY_STATE:
    parser_local._4_4_ = yaml_parser_parse_block_sequence_entry(parser,event,0);
    break;
  case YAML_PARSE_INDENTLESS_SEQUENCE_ENTRY_STATE:
    parser_local._4_4_ = yaml_parser_parse_indentless_sequence_entry(parser,event);
    break;
  case YAML_PARSE_BLOCK_MAPPING_FIRST_KEY_STATE:
    parser_local._4_4_ = yaml_parser_parse_block_mapping_key(parser,event,1);
    break;
  case YAML_PARSE_BLOCK_MAPPING_KEY_STATE:
    parser_local._4_4_ = yaml_parser_parse_block_mapping_key(parser,event,0);
    break;
  case YAML_PARSE_BLOCK_MAPPING_VALUE_STATE:
    parser_local._4_4_ = yaml_parser_parse_block_mapping_value(parser,event);
    break;
  case YAML_PARSE_FLOW_SEQUENCE_FIRST_ENTRY_STATE:
    parser_local._4_4_ = yaml_parser_parse_flow_sequence_entry(parser,event,1);
    break;
  case YAML_PARSE_FLOW_SEQUENCE_ENTRY_STATE:
    parser_local._4_4_ = yaml_parser_parse_flow_sequence_entry(parser,event,0);
    break;
  case YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_KEY_STATE:
    parser_local._4_4_ = yaml_parser_parse_flow_sequence_entry_mapping_key(parser,event);
    break;
  case YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_VALUE_STATE:
    parser_local._4_4_ = yaml_parser_parse_flow_sequence_entry_mapping_value(parser,event);
    break;
  case YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_END_STATE:
    parser_local._4_4_ = yaml_parser_parse_flow_sequence_entry_mapping_end(parser,event);
    break;
  case YAML_PARSE_FLOW_MAPPING_FIRST_KEY_STATE:
    parser_local._4_4_ = yaml_parser_parse_flow_mapping_key(parser,event,1);
    break;
  case YAML_PARSE_FLOW_MAPPING_KEY_STATE:
    parser_local._4_4_ = yaml_parser_parse_flow_mapping_key(parser,event,0);
    break;
  case YAML_PARSE_FLOW_MAPPING_VALUE_STATE:
    parser_local._4_4_ = yaml_parser_parse_flow_mapping_value(parser,event,0);
    break;
  case YAML_PARSE_FLOW_MAPPING_EMPTY_VALUE_STATE:
    parser_local._4_4_ = yaml_parser_parse_flow_mapping_value(parser,event,1);
    break;
  default:
    parser_local._4_4_ = 0;
  }
  return parser_local._4_4_;
}

Assistant:

static int
yaml_parser_state_machine(yaml_parser_t *parser, yaml_event_t *event)
{
    switch (parser->state)
    {
        case YAML_PARSE_STREAM_START_STATE:
            return yaml_parser_parse_stream_start(parser, event);

        case YAML_PARSE_IMPLICIT_DOCUMENT_START_STATE:
            return yaml_parser_parse_document_start(parser, event, 1);

        case YAML_PARSE_DOCUMENT_START_STATE:
            return yaml_parser_parse_document_start(parser, event, 0);

        case YAML_PARSE_DOCUMENT_CONTENT_STATE:
            return yaml_parser_parse_document_content(parser, event);

        case YAML_PARSE_DOCUMENT_END_STATE:
            return yaml_parser_parse_document_end(parser, event);

        case YAML_PARSE_BLOCK_NODE_STATE:
            return yaml_parser_parse_node(parser, event, 1, 0);

        case YAML_PARSE_BLOCK_NODE_OR_INDENTLESS_SEQUENCE_STATE:
            return yaml_parser_parse_node(parser, event, 1, 1);

        case YAML_PARSE_FLOW_NODE_STATE:
            return yaml_parser_parse_node(parser, event, 0, 0);

        case YAML_PARSE_BLOCK_SEQUENCE_FIRST_ENTRY_STATE:
            return yaml_parser_parse_block_sequence_entry(parser, event, 1);

        case YAML_PARSE_BLOCK_SEQUENCE_ENTRY_STATE:
            return yaml_parser_parse_block_sequence_entry(parser, event, 0);

        case YAML_PARSE_INDENTLESS_SEQUENCE_ENTRY_STATE:
            return yaml_parser_parse_indentless_sequence_entry(parser, event);

        case YAML_PARSE_BLOCK_MAPPING_FIRST_KEY_STATE:
            return yaml_parser_parse_block_mapping_key(parser, event, 1);

        case YAML_PARSE_BLOCK_MAPPING_KEY_STATE:
            return yaml_parser_parse_block_mapping_key(parser, event, 0);

        case YAML_PARSE_BLOCK_MAPPING_VALUE_STATE:
            return yaml_parser_parse_block_mapping_value(parser, event);

        case YAML_PARSE_FLOW_SEQUENCE_FIRST_ENTRY_STATE:
            return yaml_parser_parse_flow_sequence_entry(parser, event, 1);

        case YAML_PARSE_FLOW_SEQUENCE_ENTRY_STATE:
            return yaml_parser_parse_flow_sequence_entry(parser, event, 0);

        case YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_KEY_STATE:
            return yaml_parser_parse_flow_sequence_entry_mapping_key(parser, event);

        case YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_VALUE_STATE:
            return yaml_parser_parse_flow_sequence_entry_mapping_value(parser, event);

        case YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_END_STATE:
            return yaml_parser_parse_flow_sequence_entry_mapping_end(parser, event);

        case YAML_PARSE_FLOW_MAPPING_FIRST_KEY_STATE:
            return yaml_parser_parse_flow_mapping_key(parser, event, 1);

        case YAML_PARSE_FLOW_MAPPING_KEY_STATE:
            return yaml_parser_parse_flow_mapping_key(parser, event, 0);

        case YAML_PARSE_FLOW_MAPPING_VALUE_STATE:
            return yaml_parser_parse_flow_mapping_value(parser, event, 0);

        case YAML_PARSE_FLOW_MAPPING_EMPTY_VALUE_STATE:
            return yaml_parser_parse_flow_mapping_value(parser, event, 1);

        default:
            assert(1);      /* Invalid state. */
    }

    return 0;
}